

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbwrapper.cpp
# Opt level: O0

bool __thiscall CDBWrapper::IsEmpty(CDBWrapper *this)

{
  bool bVar1;
  byte bVar2;
  long in_FS_OFFSET;
  unique_ptr<CDBIterator,_std::default_delete<CDBIterator>_> it;
  CDBIterator *in_stack_ffffffffffffffb8;
  undefined6 in_stack_ffffffffffffffc8;
  CDBWrapper *this_00;
  
  this_00 = *(CDBWrapper **)(in_FS_OFFSET + 0x28);
  NewIterator(this_00);
  std::unique_ptr<CDBIterator,std::default_delete<CDBIterator>>::
  unique_ptr<std::default_delete<CDBIterator>,void>
            ((unique_ptr<CDBIterator,_std::default_delete<CDBIterator>_> *)in_stack_ffffffffffffffb8
             ,(pointer)0xf2fbe7);
  std::unique_ptr<CDBIterator,_std::default_delete<CDBIterator>_>::operator->
            ((unique_ptr<CDBIterator,_std::default_delete<CDBIterator>_> *)in_stack_ffffffffffffffb8
            );
  CDBIterator::SeekToFirst(in_stack_ffffffffffffffb8);
  std::unique_ptr<CDBIterator,_std::default_delete<CDBIterator>_>::operator->
            ((unique_ptr<CDBIterator,_std::default_delete<CDBIterator>_> *)in_stack_ffffffffffffffb8
            );
  bVar1 = CDBIterator::Valid(in_stack_ffffffffffffffb8);
  bVar2 = !bVar1;
  std::unique_ptr<CDBIterator,_std::default_delete<CDBIterator>_>::~unique_ptr
            ((unique_ptr<CDBIterator,_std::default_delete<CDBIterator>_> *)
             CONCAT17(bVar1,CONCAT16(bVar2,in_stack_ffffffffffffffc8)));
  if (*(CDBWrapper **)(in_FS_OFFSET + 0x28) == this_00) {
    return (bool)(bVar2 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool CDBWrapper::IsEmpty()
{
    std::unique_ptr<CDBIterator> it(NewIterator());
    it->SeekToFirst();
    return !(it->Valid());
}